

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase441::run(TestCase441 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Reader local_1f8;
  SegmentBuilder *local_1c8;
  SegmentBuilder *pSStack_1c0;
  CapTableBuilder *local_1b8;
  void *pvStack_1b0;
  WirePointer *local_1a8;
  Reader local_198;
  SegmentBuilder *local_168;
  SegmentBuilder *pSStack_160;
  CapTableBuilder *local_158;
  void *pvStack_150;
  WirePointer *local_148;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase441 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  local_148 = root._builder.pointers;
  local_158 = root._builder.capTable;
  pvStack_150 = root._builder.data;
  local_168 = (SegmentBuilder *)auStack_128;
  pSStack_160 = root._builder.segment;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffdf0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffdf0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestListDefaults::Builder::asReader
            (&local_198,(Builder *)auStack_128);
  reader._reader.capTable = (CapTableReader *)local_198._reader.data;
  reader._reader.segment = (SegmentReader *)local_198._reader.capTable;
  reader._reader.data = local_198._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_198._reader._32_8_;
  reader._reader.dataSize = local_198._reader.nestingLimit;
  reader._reader.pointerCount = local_198._reader._44_2_;
  reader._reader._38_2_ = local_198._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffdf8;
  checkTestMessage(reader);
  local_1a8 = root._builder.pointers;
  local_1b8 = root._builder.capTable;
  pvStack_1b0 = root._builder.data;
  local_1c8 = (SegmentBuilder *)auStack_128;
  pSStack_1c0 = root._builder.segment;
  builder_01._builder.capTable = root._builder.capTable;
  builder_01._builder.segment = root._builder.segment;
  builder_01._builder.data = root._builder.data;
  builder_01._builder.pointers = root._builder.pointers;
  builder_01._builder.dataSize = local_198._reader.nestingLimit;
  builder_01._builder.pointerCount = local_198._reader._44_2_;
  builder_01._builder._38_2_ = local_198._reader._46_2_;
  checkTestMessage(builder_01);
  capnproto_test::capnp::test::TestListDefaults::Builder::asReader
            (&local_1f8,(Builder *)auStack_128);
  reader_00._reader.capTable = (CapTableReader *)local_1f8._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_1f8._reader.capTable;
  reader_00._reader.data = local_1f8._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_1f8._reader._32_8_;
  reader_00._reader.dataSize = local_1f8._reader.nestingLimit;
  reader_00._reader.pointerCount = local_1f8._reader._44_2_;
  reader_00._reader._38_2_ = local_1f8._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffdf8;
  checkTestMessage(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, BuildListDefaults) {
  MallocMessageBuilder builder;
  TestListDefaults::Builder root = builder.getRoot<TestListDefaults>();

  initTestMessage(root);
  checkTestMessage(root.asReader());
  checkTestMessage(root);
  checkTestMessage(root.asReader());
}